

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::dragMoveEvent(QGraphicsScene *this,QGraphicsSceneDragDropEvent *event)

{
  bool bVar1;
  bool bVar2;
  DropAction DVar3;
  DropAction DVar4;
  QGraphicsScenePrivate *pQVar5;
  QGraphicsItem **ppQVar6;
  QGraphicsScenePrivate *pQVar7;
  sockaddr *__addr;
  QGraphicsScenePrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QList<QGraphicsItem_*> *__range1;
  bool eventDelivered;
  QGraphicsScenePrivate *d;
  QGraphicsSceneDragDropEvent dragLeave_1;
  QGraphicsSceneDragDropEvent dragLeave;
  QGraphicsSceneDragDropEvent dragEnter;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> items;
  QGraphicsScenePrivate *in_stack_ffffffffffffff18;
  QGraphicsScenePrivate *in_stack_ffffffffffffff20;
  QGraphicsScenePrivate *this_00;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QGraphicsScenePrivate *in_stack_ffffffffffffff38;
  QPointF *in_stack_ffffffffffffff68;
  QPoint *in_stack_ffffffffffffff70;
  QGraphicsScenePrivate *in_stack_ffffffffffffff78;
  QGraphicsSceneDragDropEvent *in_stack_ffffffffffffff80;
  QGraphicsSceneDragDropEvent *in_stack_ffffffffffffff88;
  QGraphicsScenePrivate *in_stack_ffffffffffffff90;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QGraphicsItem **local_50;
  const_iterator local_48;
  const_iterator local_40;
  QPointF local_38;
  QPoint local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsScene *)0x9d1d40);
  QEvent::ignore((QEvent *)in_RSI);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d1d60);
  if (!bVar1) {
    QGraphicsScenePrivate::clearMouseGrabber(in_stack_ffffffffffffff20);
    QMap<Qt::MouseButton,_QPointF>::clear
              ((QMap<Qt::MouseButton,_QPointF> *)in_stack_ffffffffffffff20);
    QMap<Qt::MouseButton,_QPointF>::clear
              ((QMap<Qt::MouseButton,_QPointF> *)in_stack_ffffffffffffff20);
    QMap<Qt::MouseButton,_QPoint>::clear((QMap<Qt::MouseButton,_QPoint> *)in_stack_ffffffffffffff20)
    ;
  }
  bVar1 = false;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = pQVar5;
  local_28 = QGraphicsSceneDragDropEvent::screenPos
                       ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20);
  local_38 = QGraphicsSceneDragDropEvent::scenePos((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9d1e15);
  QGraphicsScenePrivate::itemsAtPosition
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
  local_40.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff20);
  local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_ffffffffffffff20);
  do {
    local_50 = local_48.i;
    bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_40,local_48);
    DVar3 = (DropAction)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (!bVar2) {
LAB_009d213d:
      if (!bVar1) {
        if (pQVar5->dragDropItem != (QGraphicsItem *)0x0) {
          QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                    ((QGraphicsSceneDragDropEvent *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (Type)((ulong)this_00 >> 0x20));
          QGraphicsScenePrivate::cloneDragDropEvent
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          QGraphicsScenePrivate::sendDragDropEvent
                    (in_stack_ffffffffffffff38,
                     (QGraphicsItem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QGraphicsSceneDragDropEvent *)this_00);
          pQVar5->dragDropItem = (QGraphicsItem *)0x0;
          QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
                    ((QGraphicsSceneDragDropEvent *)0x9d21d3);
        }
        QGraphicsSceneDragDropEvent::setDropAction
                  ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20,DVar3);
      }
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d21ec);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    ppQVar6 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_40);
    in_stack_ffffffffffffff38 = (QGraphicsScenePrivate *)*ppQVar6;
    bVar2 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9d1ee5);
    if (bVar2) {
      bVar2 = QGraphicsItem::acceptDrops((QGraphicsItem *)0x9d1ef5);
      DVar3 = (DropAction)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if (bVar2) {
        pQVar7 = pQVar5;
        if (in_stack_ffffffffffffff38 != (QGraphicsScenePrivate *)pQVar5->dragDropItem) {
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                    ((QGraphicsSceneDragDropEvent *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (Type)((ulong)this_00 >> 0x20));
          QGraphicsScenePrivate::cloneDragDropEvent
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          QGraphicsSceneDragDropEvent::proposedAction
                    ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20);
          QGraphicsSceneDragDropEvent::setDropAction
                    ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20,DVar3);
          QGraphicsScenePrivate::sendDragDropEvent
                    (in_stack_ffffffffffffff38,
                     (QGraphicsItem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QGraphicsSceneDragDropEvent *)this_00);
          in_stack_ffffffffffffff18 = in_RSI;
          bVar2 = QEvent::isAccepted((QEvent *)&local_68);
          pQVar7 = (QGraphicsScenePrivate *)CONCAT71((int7)((ulong)pQVar7 >> 8),bVar2);
          (**(code **)(*(long *)in_stack_ffffffffffffff18 + 0x10))(in_stack_ffffffffffffff18,bVar2);
          in_stack_ffffffffffffff20 = in_RSI;
          QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)in_RSI);
          QGraphicsSceneDragDropEvent::setDropAction
                    ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20,
                     (DropAction)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          bVar2 = QEvent::isAccepted((QEvent *)in_RSI);
          if (bVar2) {
            DVar3 = QGraphicsSceneDragDropEvent::dropAction
                              ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20);
            pQVar5->lastDropAction = DVar3;
            pQVar7 = in_stack_ffffffffffffff38;
            if (pQVar5->dragDropItem != (QGraphicsItem *)0x0) {
              in_stack_ffffffffffffff80 = (QGraphicsSceneDragDropEvent *)&DAT_aaaaaaaaaaaaaaaa;
              in_stack_ffffffffffffff88 = (QGraphicsSceneDragDropEvent *)&DAT_aaaaaaaaaaaaaaaa;
              in_stack_ffffffffffffff90 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
              QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                        ((QGraphicsSceneDragDropEvent *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (Type)((ulong)this_00 >> 0x20));
              QGraphicsScenePrivate::cloneDragDropEvent
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80);
              QGraphicsScenePrivate::sendDragDropEvent
                        (in_stack_ffffffffffffff38,
                         (QGraphicsItem *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (QGraphicsSceneDragDropEvent *)this_00);
              QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
                        ((QGraphicsSceneDragDropEvent *)0x9d2096);
              pQVar7 = in_stack_ffffffffffffff38;
            }
            pQVar5->dragDropItem = (QGraphicsItem *)pQVar7;
            in_stack_ffffffffffffff34 = 0;
            in_stack_ffffffffffffff38 = pQVar7;
          }
          else {
            in_stack_ffffffffffffff34 = 3;
          }
          QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
                    ((QGraphicsSceneDragDropEvent *)0x9d20bc);
          DVar3 = (DropAction)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          if (in_stack_ffffffffffffff34 != 0) goto LAB_009d212b;
        }
        DVar4 = pQVar5->lastDropAction;
        QGraphicsSceneDragDropEvent::setDropAction
                  ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20,DVar3);
        QEvent::accept((QEvent *)in_RSI,DVar4,__addr,(socklen_t *)pQVar7);
        QGraphicsScenePrivate::sendDragDropEvent
                  (in_stack_ffffffffffffff38,
                   (QGraphicsItem *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (QGraphicsSceneDragDropEvent *)this_00);
        bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
        if (bVar1) {
          DVar4 = QGraphicsSceneDragDropEvent::dropAction
                            ((QGraphicsSceneDragDropEvent *)in_stack_ffffffffffffff20);
          pQVar5->lastDropAction = DVar4;
        }
        bVar1 = true;
        goto LAB_009d213d;
      }
    }
LAB_009d212b:
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_40);
  } while( true );
}

Assistant:

void QGraphicsScene::dragMoveEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_D(QGraphicsScene);
    event->ignore();

    if (!d->mouseGrabberItems.isEmpty()) {
        // Mouse grabbers that start drag events lose the mouse grab.
        d->clearMouseGrabber();
        d->mouseGrabberButtonDownPos.clear();
        d->mouseGrabberButtonDownScenePos.clear();
        d->mouseGrabberButtonDownScreenPos.clear();
    }

    bool eventDelivered = false;

    // Find the topmost enabled items under the cursor. They are all
    // candidates for accepting drag & drop events.
    const auto items = d->itemsAtPosition(event->screenPos(),
                                          event->scenePos(),
                                          event->widget());
    for (QGraphicsItem *item : items) {
        if (!item->isEnabled() || !item->acceptDrops())
            continue;

        if (item != d->dragDropItem) {
            // Enter the new drag drop item. If it accepts the event, we send
            // the leave to the parent item.
            QGraphicsSceneDragDropEvent dragEnter(QEvent::GraphicsSceneDragEnter);
            d->cloneDragDropEvent(&dragEnter, event);
            dragEnter.setDropAction(event->proposedAction());
            d->sendDragDropEvent(item, &dragEnter);
            event->setAccepted(dragEnter.isAccepted());
            event->setDropAction(dragEnter.dropAction());
            if (!event->isAccepted()) {
                // Propagate to the item under
                continue;
            }

            d->lastDropAction = event->dropAction();

            if (d->dragDropItem) {
                // Leave the last drag drop item. A perfect implementation
                // would set the position of this event to the point where
                // this event and the last event intersect with the item's
                // shape, but that's not easy to do. :-)
                QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
                d->cloneDragDropEvent(&dragLeave, event);
                d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            }

            // We've got a new drag & drop item
            d->dragDropItem = item;
        }

        // Send the move event.
        event->setDropAction(d->lastDropAction);
        event->accept();
        d->sendDragDropEvent(item, event);
        if (event->isAccepted())
            d->lastDropAction = event->dropAction();
        eventDelivered = true;
        break;
    }

    if (!eventDelivered) {
        if (d->dragDropItem) {
            // Leave the last drag drop item
            QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
            d->cloneDragDropEvent(&dragLeave, event);
            d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            d->dragDropItem = nullptr;
        }
        // Propagate
        event->setDropAction(Qt::IgnoreAction);
    }
}